

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O0

optional<absl::lts_20250127::Cord> * __thiscall
absl::lts_20250127::status_internal::StatusRep::GetPayload
          (optional<absl::lts_20250127::Cord> *__return_storage_ptr__,StatusRep *this,
          string_view type_url)

{
  bool bVar1;
  status_internal *this_00;
  type this_01;
  unsigned_long *puVar2;
  reference pVVar3;
  char *pcVar4;
  optional<unsigned_long> oVar5;
  string_view type_url_00;
  _Storage<unsigned_long,_true> local_38;
  optional<unsigned_long> index;
  StatusRep *this_local;
  string_view type_url_local;
  
  pcVar4 = type_url._M_str;
  index.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = this;
  this_00 = (status_internal *)
            std::
            unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
            ::get(&this->payloads_);
  type_url_00._M_str = pcVar4;
  type_url_00._M_len = (size_t)type_url._M_str;
  oVar5 = FindPayloadIndexByUrl(this_00,(Payloads *)type_url._M_len,type_url_00);
  local_38._M_value =
       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  index.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  bVar1 = std::optional<unsigned_long>::has_value((optional<unsigned_long> *)&local_38);
  if (bVar1) {
    this_01 = std::
              unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
              ::operator*(&this->payloads_);
    puVar2 = std::optional<unsigned_long>::value((optional<unsigned_long> *)&local_38);
    pVVar3 = InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
             ::operator[](this_01,*puVar2);
    std::optional<absl::lts_20250127::Cord>::optional<absl::lts_20250127::Cord_&,_true>
              (__return_storage_ptr__,&pVVar3->payload);
  }
  else {
    std::optional<absl::lts_20250127::Cord>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

absl::optional<absl::Cord> StatusRep::GetPayload(
    absl::string_view type_url) const {
  absl::optional<size_t> index =
      status_internal::FindPayloadIndexByUrl(payloads_.get(), type_url);
  if (index.has_value()) return (*payloads_)[index.value()].payload;

  return absl::nullopt;
}